

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SaveSettings(void)

{
  ImVector<ImGuiWindow_*> *this;
  float fVar1;
  value_type pIVar2;
  ImGuiContext *pIVar3;
  value_type *ppIVar4;
  ImGuiIniData *pIVar5;
  FILE *__stream;
  value_type *pvVar6;
  char *pcVar7;
  int i;
  int iVar8;
  int i_1;
  char *pcVar9;
  
  pIVar3 = GImGui;
  pcVar9 = (GImGui->IO).IniFilename;
  if (pcVar9 != (char *)0x0) {
    this = &GImGui->Windows;
    for (iVar8 = 0; iVar8 != this->Size; iVar8 = iVar8 + 1) {
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,iVar8);
      pIVar2 = *ppIVar4;
      if ((pIVar2->Flags & 0x100) == 0) {
        pIVar5 = FindWindowSettings(pIVar2->Name);
        pIVar5->Pos = pIVar2->Pos;
        pIVar5->Size = pIVar2->SizeFull;
        pIVar5->Collapsed = pIVar2->Collapsed;
      }
    }
    __stream = fopen(pcVar9,"wt");
    if (__stream != (FILE *)0x0) {
      for (iVar8 = 0; iVar8 != (pIVar3->Settings).Size; iVar8 = iVar8 + 1) {
        pvVar6 = ImVector<ImGuiIniData>::operator[](&pIVar3->Settings,iVar8);
        fVar1 = (pvVar6->Pos).x;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          pcVar9 = pvVar6->Name;
          pcVar7 = strstr(pcVar9,"###");
          if (pcVar7 != (char *)0x0) {
            pcVar9 = pcVar7;
          }
          fprintf(__stream,"[%s]\n",pcVar9);
          fprintf(__stream,"Pos=%d,%d\n",(ulong)(uint)(int)(pvVar6->Pos).x,
                  (ulong)(uint)(int)(pvVar6->Pos).y);
          fprintf(__stream,"Size=%d,%d\n",(ulong)(uint)(int)(pvVar6->Size).x,
                  (ulong)(uint)(int)(pvVar6->Size).y);
          fprintf(__stream,"Collapsed=%d\n",(ulong)pvVar6->Collapsed);
          fputc(10,__stream);
        }
      }
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

static void SaveSettings()
{
    ImGuiContext& g = *GImGui;
    const char* filename = g.IO.IniFilename;
    if (!filename)
        return;

    // Gather data from windows that were active during this session
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiIniData* settings = FindWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write .ini file
    // If a window wasn't opened in this session we preserve its settings
    FILE* f = fopen(filename, "wt");
    if (!f)
        return;
    for (int i = 0; i != g.Settings.Size; i++)
    {
        const ImGuiIniData* settings = &g.Settings[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        fprintf(f, "[%s]\n", name);
        fprintf(f, "Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        fprintf(f, "Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        fprintf(f, "Collapsed=%d\n", settings->Collapsed);
        fprintf(f, "\n");
    }

    fclose(f);
}